

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParsePurpose(AsciiParser *this,Purpose *result)

{
  bool bVar1;
  ostream *poVar2;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  ostringstream ss_e;
  
  if ((result == (Purpose *)0x0) || (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), !bVar1))
  {
    return false;
  }
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  bVar1 = ReadIdentifier(this,&str);
  if (bVar1) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &str,"\"default\"");
    if (bVar1) {
      *result = Default;
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&str,"\"render\"");
      if (bVar1) {
        *result = Render;
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&str,"\"proxy\"");
        if (bVar1) {
          *result = Proxy;
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&str,"\"guide\"");
          if (!bVar1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[ASCII]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParsePurpose");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7ff);
            ::std::operator<<(poVar2," ");
            ::std::operator+(&local_1c0,"Invalid purpose value: ",&str);
            ::std::operator+(&local_1e0,&local_1c0,"\n");
            poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_1e0);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
            PushError(this,&local_1e0);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            goto LAB_002bb14f;
          }
          *result = Guide;
        }
      }
    }
    bVar1 = true;
  }
  else {
LAB_002bb14f:
    bVar1 = false;
  }
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool AsciiParser::ParsePurpose(Purpose *result) {
  if (!result) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  std::string str;
  if (!ReadIdentifier(&str)) {
    return false;
  }

  if (str == "\"default\"") {
    (*result) = Purpose::Default;
  } else if (str == "\"render\"") {
    (*result) = Purpose::Render;
  } else if (str == "\"proxy\"") {
    (*result) = Purpose::Proxy;
  } else if (str == "\"guide\"") {
    (*result) = Purpose::Guide;
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Invalid purpose value: " + str + "\n");
  }

  return true;
}